

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int get_float_attr(attr_list l,atom_t attr_id,float *valp)

{
  int iVar1;
  attr_value_type t;
  attr_union v;
  
  iVar1 = query_pattr(l,attr_id,&t,&v);
  if (iVar1 == 0) {
    return 0;
  }
  switch(t) {
  case Attr_Int4:
  case Attr_Int8:
    v.u.f = (float)v.u.i;
    break;
  default:
    return 0;
  case Attr_Float16:
    goto switchD_001056f7_caseD_3;
  case Attr_Float8:
    v.u.f = (float)(double)CONCAT44(v.u.l._4_4_,v.u.i);
    break;
  case Attr_Float4:
  }
  *valp = v.u.f;
switchD_001056f7_caseD_3:
  return 1;
}

Assistant:

int
get_float_attr(attr_list l, atom_t attr_id, float *valp)
{
    attr_value_type t;
    attr_union v;
    int ret = query_pattr(l, attr_id, &t, &v);
    if (ret == 0) return 0;
    switch(t) {
    case Attr_Int4:
	if (sizeof(int) == 4) *valp = (float)v.u.i;
	*valp = (float)v.u.i;
	break;
    case Attr_Int8:
	if (sizeof(long) == 8) *valp = (float)v.u.l;
	*valp = (float)v.u.i;
	break;
    case Attr_Float16:
	if (sizeof(double) == 16) *valp = (float)v.u.d;
	if (sizeof(float) == 16) *valp = v.u.f;
	break;
    case Attr_Float8:
	if (sizeof(double) == 8) *valp = (float)v.u.d;
	if (sizeof(float) == 8) *valp = v.u.f;
	break;
    case Attr_Float4:
	if (sizeof(double) == 4) *valp = (float)v.u.d;
	if (sizeof(float) == 4) *valp = v.u.f;
	break;
    default:
	return 0;
    }
    return 1;
}